

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  char *pcVar1;
  size_t sVar2;
  Curl_header_store *ne;
  Curl_header_store *pCVar3;
  char *pcVar4;
  char *pcVar5;
  uchar *puVar6;
  char cVar7;
  ulong __n;
  
  cVar7 = *header;
  if (cVar7 == '\n') {
    return CURLE_OK;
  }
  if (cVar7 == '\r') {
    return CURLE_OK;
  }
  pcVar1 = strchr(header,0xd);
  if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(header,10), pcVar1 == (char *)0x0)) {
    return CURLE_WEIRD_SERVER_REPLY;
  }
  __n = (long)pcVar1 - (long)header;
  if ((cVar7 == ' ') || (cVar7 == '\t')) {
    pCVar3 = (data->state).prevhead;
    if (pCVar3 != (Curl_header_store *)0x0) {
      pcVar1 = pCVar3->value;
      sVar2 = strlen(pcVar1);
      for (; __n != 0; __n = __n - 1) {
        if ((header[__n - 1] != ' ') && (header[__n - 1] != '\t')) {
          if (1 < __n) {
            pcVar5 = header + (__n - 1);
            goto LAB_00131254;
          }
          __n = 1;
          goto LAB_001310b8;
        }
      }
      __n = 0;
      goto LAB_001310b8;
    }
    while( true ) {
      if (__n == 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*header != ' ') && (*header != '\t')) break;
      header = header + 1;
      __n = __n - 1;
    }
  }
  pCVar3 = (Curl_header_store *)(*Curl_ccalloc)(1,__n + 0x38);
  if (pCVar3 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar1 = pCVar3->buffer;
  memcpy(pcVar1,header,__n);
  pCVar3->buffer[__n] = '\0';
  pcVar5 = pcVar1;
  if (type == '\x10') {
    if (*pcVar1 != ':') goto LAB_00131229;
    pcVar5 = &pCVar3->field_0x36;
  }
  puVar6 = (uchar *)(pCVar3->buffer + __n);
  while( true ) {
    pcVar4 = pcVar5;
    pcVar5 = pcVar4 + 1;
    if (*pcVar4 == '\0') break;
    if (*pcVar4 == ':') {
      *pcVar4 = '\0';
      for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
      }
      while ((puVar6 = puVar6 + -1, pcVar5 < puVar6 && ((*puVar6 == ' ' || (*puVar6 == '\t'))))) {
        *puVar6 = '\0';
      }
      pCVar3->name = pcVar1;
      pCVar3->value = pcVar5;
      pCVar3->type = type;
      pCVar3->request = (data->state).requests;
      Curl_llist_append(&(data->state).httphdrs,pCVar3,(Curl_llist_node *)pCVar3);
      (data->state).prevhead = pCVar3;
      return CURLE_OK;
    }
  }
LAB_00131229:
  (*Curl_cfree)(pCVar3);
  return CURLE_BAD_FUNCTION_ARGUMENT;
  while( true ) {
    header = header + 1;
    __n = __n - 1;
    if (__n < 2) break;
LAB_00131254:
    if (((cVar7 != ' ') && (cVar7 != '\t')) ||
       ((cVar7 = header[1], cVar7 != ' ' && (cVar7 != '\t')))) goto LAB_001310b8;
  }
  __n = 1;
  header = pcVar5;
LAB_001310b8:
  Curl_node_remove(&pCVar3->node);
  ne = (Curl_header_store *)
       Curl_saferealloc(pCVar3,(size_t)(pcVar1 + __n + sVar2 + -(long)pCVar3 + 5));
  if (ne == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  ne->name = ne->buffer;
  ne->value = pcVar1 + -(long)pCVar3 + (long)(ne->buffer + -0x35);
  memcpy(pcVar1 + -(long)pCVar3 + (long)(ne->buffer + -0x35) + sVar2,header,__n);
  ne->value[__n + sVar2] = '\0';
  Curl_llist_append(&(data->state).httphdrs,ne,(Curl_llist_node *)ne);
  (data->state).prevhead = ne;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      /* neither CR nor LF as terminator is not a valid header */
      return CURLE_WEIRD_SERVER_REPLY;
  }
  hlen = end - header;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else {
      /* cannot unfold without a previous header. Instead of erroring, just
         pass the leading blanks. */
      while(hlen && ISBLANK(*header)) {
        header++;
        hlen--;
      }
      if(!hlen)
        return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(!result) {
    hs->name = name;
    hs->value = value;
    hs->type = type;
    hs->request = data->state.requests;

    /* insert this node into the list of headers */
    Curl_llist_append(&data->state.httphdrs, hs, &hs->node);
    data->state.prevhead = hs;
  }
  else
    free(hs);
  return result;
}